

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMap.hpp
# Opt level: O2

void __thiscall Lib::ArrayMap<Kernel::TermList>::reset(ArrayMap<Kernel::TermList> *this)

{
  uint *puVar1;
  long lVar2;
  ArrayMapEntry<Kernel::TermList> *pAVar3;
  
  puVar1 = &this->_timestamp;
  *puVar1 = *puVar1 + 1;
  if (*puVar1 == 0) {
    pAVar3 = (this->super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>)._array;
    for (lVar2 = (this->super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>)._capacity << 4;
        lVar2 != 0; lVar2 = lVar2 + -0x10) {
      pAVar3->_timestamp = 0;
      pAVar3 = pAVar3 + 1;
    }
    this->_timestamp = 1;
  }
  return;
}

Assistant:

void reset()
  {
    _timestamp++;
    if(_timestamp==0) {
      Entry* nptr=DArray<Entry>::_array;
      Entry* afterLast=DArray<Entry>::_array +DArray<Entry>::_capacity;
      while(nptr!=afterLast) {
        (nptr++)->_timestamp=0;
      }
      _timestamp=1;
    }
  }